

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O2

string * tinyusdz::print_str_attr
                   (string *__return_storage_ptr__,
                   TypedAttribute<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *attr,string *name,uint32_t indent)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pSVar2;
  Path *v;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  value_type *pvVar7;
  ostream *poVar8;
  vector<tinyusdz::TypedTimeSamples<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Sample>_>
  *pvVar9;
  long lVar10;
  ostream *poVar11;
  uint32_t uVar12;
  pointer pPVar13;
  uint32_t n;
  uint32_t n_00;
  uint32_t extraout_EDX;
  uint32_t extraout_EDX_00;
  uint32_t n_01;
  char cVar14;
  long lVar15;
  size_t i;
  pprint *this;
  ulong uVar16;
  bool bVar17;
  bool bVar18;
  string local_3b0;
  optional<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_390;
  string a;
  stringstream ss;
  ostream local_1a8 [376];
  
  this = (pprint *)(ulong)indent;
  ::std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  bVar3 = TypedAttribute<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::authored(attr);
  if (bVar3) {
    bVar4 = TypedAttribute<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::is_value_empty(attr);
    pPVar13 = (attr->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    bVar17 = pPVar13 !=
             (attr->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
             _M_impl.super__Vector_impl_data._M_start;
    bVar3 = (attr->_attrib).has_value_;
    nonstd::optional_lite::
    optional<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::optional(&local_390,&attr->_attrib);
    if (local_390.has_value_ == true) {
      pvVar7 = nonstd::optional_lite::
               optional<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::value(&local_390);
      cVar14 = pvVar7->_has_value;
    }
    else {
      cVar14 = '\0';
    }
    if ((local_390.has_value_ & 1U) == 0) {
      bVar5 = false;
    }
    else {
      pvVar7 = nonstd::optional_lite::
               optional<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::value(&local_390);
      bVar5 = Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::has_timesamples(pvVar7);
    }
    if ((((local_390.has_value_ & 1U) == 0) ||
        (pvVar7 = nonstd::optional_lite::
                  optional<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::value(&local_390), pvVar7->_blocked != false)) || (pvVar7->_has_value != false))
    {
      bVar18 = false;
    }
    else {
      pPVar13 = (pointer)(pvVar7->_ts)._samples.
                         super__Vector_base<tinyusdz::TypedTimeSamples<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Sample>_>
                         ._M_impl.super__Vector_impl_data._M_start;
      bVar18 = pPVar13 !=
               (pointer)(pvVar7->_ts)._samples.
                        super__Vector_base<tinyusdz::TypedTimeSamples<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Sample>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
    }
    uVar12 = (uint32_t)pPVar13;
    bVar6 = AttrMetas::authored(&attr->_metas);
    if (((bVar6) || ((byte)(bVar17 & (bVar3 ^ 1U) | bVar18) != 1)) ||
       (n_01 = n, bVar4 || (cVar14 != '\0' || attr->_blocked != false))) {
      pprint::Indent_abi_cxx11_(&a,this,n);
      ::std::operator<<(local_1a8,(string *)&a);
      ::std::__cxx11::string::_M_dispose();
      value::
      TypeTraits<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      type_name();
      poVar8 = ::std::operator<<(local_1a8,(string *)&a);
      poVar8 = ::std::operator<<(poVar8," ");
      ::std::operator<<(poVar8,(string *)name);
      ::std::__cxx11::string::_M_dispose();
      if (attr->_blocked == true) {
        ::std::operator<<(local_1a8," = None");
      }
      else if (local_390.has_value_ == true) {
        a._M_dataplus._M_p = (pointer)&a.field_2;
        a._M_string_length = 0;
        a.field_2._M_local_buf[0] = '\0';
        pvVar7 = nonstd::optional_lite::
                 optional<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::value(&local_390);
        bVar3 = Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::get_scalar(pvVar7,&a);
        if (bVar3) {
          poVar8 = ::std::operator<<(local_1a8," = ");
          buildEscapedAndQuotedStringForUSDA(&local_3b0,&a);
          ::std::operator<<(poVar8,(string *)&local_3b0);
          ::std::__cxx11::string::_M_dispose();
        }
        else {
          ::std::operator<<(local_1a8," = [InternalError]");
        }
        ::std::__cxx11::string::_M_dispose();
      }
      bVar3 = AttrMetas::authored(&attr->_metas);
      if (bVar3) {
        poVar8 = ::std::operator<<(local_1a8,"(\n");
        print_attr_metas_abi_cxx11_(&a,(tinyusdz *)attr,(AttrMeta *)(ulong)(indent + 1),uVar12);
        poVar8 = ::std::operator<<(poVar8,(string *)&a);
        pprint::Indent_abi_cxx11_(&local_3b0,this,n_00);
        poVar8 = ::std::operator<<(poVar8,(string *)&local_3b0);
        ::std::operator<<(poVar8,")");
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
      }
      ::std::operator<<(local_1a8,"\n");
      n_01 = extraout_EDX;
    }
    if (bVar5 != false) {
      pprint::Indent_abi_cxx11_(&a,this,n_01);
      ::std::operator<<(local_1a8,(string *)&a);
      ::std::__cxx11::string::_M_dispose();
      value::
      TypeTraits<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      type_name();
      poVar8 = ::std::operator<<(local_1a8,(string *)&a);
      poVar8 = ::std::operator<<(poVar8," ");
      ::std::operator<<(poVar8,(string *)name);
      ::std::__cxx11::string::_M_dispose();
      poVar8 = ::std::operator<<(local_1a8,".timeSamples = ");
      pvVar7 = nonstd::optional_lite::
               optional<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::value(&local_390);
      ::std::__cxx11::stringstream::stringstream((stringstream *)&a);
      paVar1 = &a.field_2;
      ::std::operator<<((ostream *)paVar1->_M_local_buf,"{\n");
      pvVar9 = TypedTimeSamples<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::get_samples(&pvVar7->_ts);
      lVar15 = 0;
      for (uVar16 = 0;
          lVar10 = (long)(pvVar9->
                         super__Vector_base<tinyusdz::TypedTimeSamples<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Sample>_>
                         )._M_impl.super__Vector_impl_data._M_finish -
                   (long)(pvVar9->
                         super__Vector_base<tinyusdz::TypedTimeSamples<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Sample>_>
                         )._M_impl.super__Vector_impl_data._M_start,
          uVar12 = (uint32_t)(lVar10 % 0x30), uVar16 < (ulong)(lVar10 / 0x30); uVar16 = uVar16 + 1)
      {
        pprint::Indent_abi_cxx11_(&local_3b0,(pprint *)(ulong)(indent + 1),uVar12);
        ::std::operator<<((ostream *)paVar1->_M_local_buf,(string *)&local_3b0);
        poVar11 = ::std::ostream::_M_insert<double>
                            (*(double *)
                              ((long)&((pvVar9->
                                       super__Vector_base<tinyusdz::TypedTimeSamples<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Sample>_>
                                       )._M_impl.super__Vector_impl_data._M_start)->t + lVar15));
        ::std::operator<<(poVar11,": ");
        ::std::__cxx11::string::_M_dispose();
        pSVar2 = (pvVar9->
                 super__Vector_base<tinyusdz::TypedTimeSamples<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Sample>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        if ((&pSVar2->blocked)[lVar15] == true) {
          ::std::operator<<((ostream *)paVar1->_M_local_buf,"None");
        }
        else {
          buildEscapedAndQuotedStringForUSDA
                    (&local_3b0,(string *)((long)&(pSVar2->value)._M_dataplus._M_p + lVar15));
          ::std::operator<<((ostream *)paVar1->_M_local_buf,(string *)&local_3b0);
          ::std::__cxx11::string::_M_dispose();
        }
        ::std::operator<<((ostream *)paVar1->_M_local_buf,",\n");
        lVar15 = lVar15 + 0x30;
      }
      pprint::Indent_abi_cxx11_(&local_3b0,this,uVar12);
      poVar11 = ::std::operator<<((ostream *)paVar1->_M_local_buf,(string *)&local_3b0);
      ::std::operator<<(poVar11,"}\n");
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::stringbuf::str();
      ::std::__cxx11::stringstream::~stringstream((stringstream *)&a);
      ::std::operator<<(poVar8,(string *)&local_3b0);
      ::std::__cxx11::string::_M_dispose();
      ::std::operator<<(local_1a8,"\n");
      n_01 = extraout_EDX_00;
    }
    if ((attr->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        (attr->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
        super__Vector_impl_data._M_start) {
      pprint::Indent_abi_cxx11_(&a,this,n_01);
      ::std::operator<<(local_1a8,(string *)&a);
      ::std::__cxx11::string::_M_dispose();
      value::
      TypeTraits<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      type_name();
      poVar8 = ::std::operator<<(local_1a8,(string *)&a);
      poVar8 = ::std::operator<<(poVar8," ");
      ::std::operator<<(poVar8,(string *)name);
      ::std::__cxx11::string::_M_dispose();
      ::std::operator<<(local_1a8,".connect = ");
      v = (attr->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl
          .super__Vector_impl_data._M_start;
      lVar15 = ((long)(attr->_paths).
                      super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)v) / 0xd0;
      if (lVar15 == 0) {
        ::std::operator<<(local_1a8,"[InternalError]");
      }
      else if (lVar15 == 1) {
        ::std::operator<<(local_1a8,v);
      }
      else {
        ::std::operator<<(local_1a8,&attr->_paths);
      }
      ::std::operator<<(local_1a8,"\n");
    }
    nonstd::optional_lite::
    optional<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~optional(&local_390);
  }
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  return __return_storage_ptr__;
}

Assistant:

static std::string print_str_attr(
    const TypedAttribute<Animatable<std::string>> &attr,
    const std::string &name, const uint32_t indent) {
  std::stringstream ss;

  if (attr.authored()) {

    bool is_value_empty = attr.is_value_empty();
    bool is_connection = attr.is_connection();
    bool has_default{false};
    bool has_timesamples{false};
    bool is_timesamples{false};
    const auto &pv = attr.get_value();
    DCOUT("is_value_empty " << is_value_empty);
    DCOUT("is_connection " << is_connection);
    DCOUT("is_timesamples " << is_timesamples);
    DCOUT("has_default " << has_default);

    has_default = (pv && pv.value().has_default());
    has_timesamples = (pv && pv.value().has_timesamples());
    is_timesamples = (pv && pv.value().is_timesamples());

    if (attr.metas().authored() || attr.is_blocked() || has_default || is_value_empty || ((!is_connection) && (!is_timesamples))) {
      ss << pprint::Indent(indent);
      ss << value::TypeTraits<std::string>::type_name() << " " << name;

      if (attr.is_blocked()) {
        ss << " = None";
      } else if (pv.has_value()) {

        std::string a;
        if (pv.value().get_scalar(&a)) {
          // Do not use operator<<(std::string)
          ss << " = " << tinyusdz::buildEscapedAndQuotedStringForUSDA(a);
        } else {
          ss << " = [InternalError]";
        }
      }

      if (attr.metas().authored()) {
        ss << "(\n"
           << print_attr_metas(attr.metas(), indent + 1) << pprint::Indent(indent)
           << ")";
      }
      ss << "\n";
    }

    if (has_timesamples) {
      ss << pprint::Indent(indent);
      ss << value::TypeTraits<std::string>::type_name() << " " << name;

      ss << ".timeSamples = "
               << print_str_timesamples(pv.value().get_timesamples(), indent);

      ss << "\n";
    }

    if (attr.has_connections()) {

      ss << pprint::Indent(indent);
      ss << value::TypeTraits<std::string>::type_name() << " " << name;

      ss << ".connect = ";
      const std::vector<Path> &paths = attr.get_connections();
      if (paths.size() == 1) {
        ss << paths[0];
      } else if (paths.size() == 0) {
        ss << "[InternalError]";
      } else {
        ss << paths;
      }

      ss << "\n";
    }
  }

  return ss.str();
}